

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstar.cpp
# Opt level: O0

void __thiscall
GMAA_MAAstar::SelectPoliciesToProcessFurther
          (GMAA_MAAstar *this,PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool are_LBs,
          double bestLB)

{
  size_t sVar1;
  type pPVar2;
  byte in_DL;
  shared_ptr<PartialPolicyPoolInterface> *in_RSI;
  undefined1 local_30 [31];
  byte local_11;
  shared_ptr<PartialPolicyPoolInterface> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (local_11 != 0) {
    while( true ) {
      boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      sVar1 = PartialPolicyPoolInterface::Empty((PartialPolicyPoolInterface *)0x967537);
      if (sVar1 != 0) break;
      pPVar2 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x967564);
      (*pPVar2->_vptr_PartialPolicyPoolInterface[5])(pPVar2,local_30);
      boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x967583);
    }
  }
  return;
}

Assistant:

void GMAA_MAAstar::SelectPoliciesToProcessFurther(
    const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
    bool are_LBs, double bestLB)
{
    //for MAA*, all policies are processed further when they aren't full
    //policies (i.e. lower bounds)
    //so, unless these are full policies...

    if(are_LBs)
    {
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
    }
    //we can return immediately...
    return;
}